

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

bool Am_Delete_Selective_Undo_Allowed_proc(Am_Object *command_obj)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Value local_48;
  undefined1 local_35;
  bool ret;
  undefined1 local_28 [8];
  Am_Value value;
  Am_Object *command_obj_local;
  
  value.value = (anon_union_8_8_ea4c8939_for_value)command_obj;
  bVar1 = Am_Object::Valid(command_obj);
  if (bVar1) {
    Am_Value::Am_Value((Am_Value *)local_28);
    in_value = Am_Object::Peek(command_obj,0x16d,4);
    Am_Value::operator=((Am_Value *)local_28,in_value);
    Am_Value::Am_Value(&local_48,(Am_Value *)local_28);
    bVar1 = Am_Valid_and_Visible_List_Or_Object(&local_48,true);
    Am_Value::~Am_Value(&local_48);
    command_obj_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
    local_35 = bVar1;
    Am_Value::~Am_Value((Am_Value *)local_28);
  }
  else {
    command_obj_local._7_1_ = false;
  }
  return command_obj_local._7_1_;
}

Assistant:

Am_Define_Method(Am_Selective_Allowed_Method, bool,
                 Am_Delete_Selective_Undo_Allowed, (Am_Object command_obj))
{
  if (!command_obj.Valid())
    return false;
  Am_Value value;
  value = command_obj.Peek(Am_OBJECT_MODIFIED, Am_NO_DEPENDENCY);
  bool ret = Am_Valid_and_Visible_List_Or_Object(value);
  //std::cout << "*** valid and vis returns " << ret << " for obj mod " << value
  //      << " in command " << command_obj <<std::endl <<std::flush;
  return !ret;
}